

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

void __thiscall
rtb::Filter::Polynomial<double>::Polynomial
          (Polynomial<double> *this,initializer_list<double> *coefficients)

{
  pointer *ppcVar1;
  size_type sVar2;
  iterator pdVar3;
  iterator __position;
  size_t sVar4;
  long lVar5;
  complex<double> local_38;
  
  (this->coefficients_).
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coefficients_).
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coefficients_).
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar2 = coefficients->_M_len;
  if (sVar2 != 0) {
    pdVar3 = coefficients->_M_array;
    lVar5 = 0;
    do {
      local_38._M_value._0_8_ = *(undefined8 *)((long)pdVar3 + lVar5);
      local_38._M_value._8_8_ = 0;
      __position._M_current =
           (this->coefficients_).
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->coefficients_).
          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        _M_realloc_insert<std::complex<double>>
                  ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)this,
                   __position,&local_38);
      }
      else {
        *(undefined8 *)(__position._M_current)->_M_value = local_38._M_value._0_8_;
        *(undefined8 *)((__position._M_current)->_M_value + 8) = 0;
        ppcVar1 = &(this->coefficients_).
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      lVar5 = lVar5 + 8;
    } while (sVar2 << 3 != lVar5);
  }
  removeHighOrderZeroCoefficients(this);
  sVar4 = (long)(this->coefficients_).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->coefficients_).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4;
  this->size_ = sVar4;
  this->order_ = sVar4 - 1;
  return;
}

Assistant:

Polynomial<T>::Polynomial(const std::initializer_list<T>& coefficients) {

            for (auto c : coefficients)
                coefficients_.push_back(c);

            removeHighOrderZeroCoefficients();
            updateOrderAndSize();
        }